

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
::operator()(impl<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  PyTypeObject *pPVar2;
  long lVar3;
  code *pcVar4;
  long *plVar5;
  PyObject *pPVar6;
  code *pcVar7;
  undefined4 *puVar8;
  c_t1 c1;
  c_t2 c2;
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 local_98 [16];
  long *local_88 [2];
  long local_78 [2];
  _object *local_68;
  undefined1 local_50 [16];
  PyTypeObject *local_38;
  
  lVar3 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<AbstractModuleClient_const_volatile&>::
                     converters);
  if (lVar3 != 0) {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_98 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::
                                 registered_base<std::__cxx11::string_const_volatile&>::converters);
    if (local_98._0_8_ != 0) {
      pPVar2 = args_[2].ob_type;
      local_68 = p_Var1;
      local_50 = converter::rvalue_from_python_stage1
                           ((_object *)pPVar2,
                            converter::detail::registered_base<unsigned_int_const_volatile&>::
                            converters);
      pcVar4 = local_50._8_8_;
      puVar8 = local_50._0_8_;
      local_38 = pPVar2;
      if (puVar8 == (undefined4 *)0x0) {
        pPVar6 = (PyObject *)0x0;
      }
      else {
        pcVar7 = (code *)(this->m_data).
                         super_compressed_pair_imp<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_2>
                         .first_;
        plVar5 = (long *)(lVar3 + *(long *)&(this->m_data).
                                            super_compressed_pair_imp<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_2>
                                            .field_0x8);
        if (((ulong)pcVar7 & 1) != 0) {
          pcVar7 = *(code **)(pcVar7 + *plVar5 + -1);
        }
        if ((code *)local_98._8_8_ != (code *)0x0) {
          (*(code *)local_98._8_8_)(local_68);
        }
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,*(long *)local_98._0_8_,
                   *(long *)(local_98._0_8_ + 8) + *(long *)local_98._0_8_);
        if (pcVar4 != (code *)0x0) {
          (*pcVar4)(pPVar2,local_50);
          puVar8 = (undefined4 *)local_50._0_8_;
        }
        (*pcVar7)(plVar5,local_b8,*puVar8);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        pPVar6 = (PyObject *)&_Py_NoneStruct;
        __Py_NoneStruct = __Py_NoneStruct + 1;
      }
      if ((long **)local_98._0_8_ != local_88) {
        return pPVar6;
      }
      if (local_88[0] == local_78) {
        return pPVar6;
      }
      operator_delete(local_88[0],local_78[0] + 1);
      return pPVar6;
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }